

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O1

int pztopology::TPZTetrahedron::ContainedSideLocId(int side,int node)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  
  if (0xf < (uint)side) {
    return -1;
  }
  if (side < 4) {
    if (node == 0) {
      return side;
    }
    goto LAB_00dff299;
  }
  if (side < 7) {
    if (node == 2) goto LAB_00dff259;
    if (node == 1) {
      uVar2 = (side - 3U) % 3;
LAB_00dff293:
      bVar1 = false;
    }
    else {
      if (node == 0) {
        uVar2 = side - 4;
        goto LAB_00dff293;
      }
LAB_00dff25f:
      bVar1 = true;
      uVar2 = 0xffffffff;
    }
  }
  else {
    if (9 < side) {
      if (side < 0xe) {
        if (node < 7) {
          return *(int *)(FaceConnectLocId + (long)node * 4 + (ulong)(side - 10) * 0x1c);
        }
      }
      else if (side == 0xe && node < 0xf) {
        return node;
      }
      goto LAB_00dff299;
    }
    if (node != 2) {
      if (node == 1) {
        uVar2 = 3;
      }
      else {
        if (node != 0) goto LAB_00dff25f;
        uVar2 = side - 7;
      }
      goto LAB_00dff293;
    }
LAB_00dff259:
    bVar1 = false;
    uVar2 = side;
  }
  if (!bVar1) {
    return uVar2;
  }
LAB_00dff299:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TPZShapeTetra::ContainedSideLocId called for node = ",0x34);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,node);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," and side = ",0xc);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,side);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  return -1;
}

Assistant:

int TPZTetrahedron::ContainedSideLocId(int side, int node) {
		if(side<0 || side>15) return -1;
		if(side<4) {
			if(node==0) return side;
		} else
			if(side<7) {//4,5,6
				int s = side-4;//0,1,2
				if(!node) return s;//0,1,2
				if(node==1) return (s+1)%3;//1,2,0
				if(node==2) return side;//4,5,6
			} else
				if(side<10) {//7,8,9
					int s = side-7;//0,1,2
					if(!node) return s;//0,1,2
					if(node==1) return 3;//4,4,4
					if(node==2) return side;//7,8,9
				} else
					if(side<14) {//10 a 13
						int s = side-10;
						if(node<7) return FaceConnectLocId[s][node];
					} else
						if(side==14 && node<15){
							return node;
						}
		PZError << "TPZShapeTetra::ContainedSideLocId called for node = "
		<< node << " and side = " << side << "\n";
		return -1;
	}